

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

shared_ptr<kratos::Port> __thiscall
kratos::FunctionStmtBlock::get_port(FunctionStmtBlock *this,string *port_name)

{
  iterator iVar1;
  __shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  UserException *this_00;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::Port> sVar3;
  basic_string_view<char> bVar4;
  string_view format_str;
  format_args args;
  string local_58;
  pointer local_38;
  size_type sStack_30;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                  *)&port_name[8]._M_string_length,in_RDX);
  if (iVar1._M_node != (_Base_ptr)&port_name[8].field_2) {
    p_Var2 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                    *)&port_name[8]._M_string_length,in_RDX)->
              super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    sVar3.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<kratos::Port>)
           sVar3.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_38 = (in_RDX->_M_dataplus)._M_p;
  sStack_30 = in_RDX->_M_string_length;
  bVar4 = fmt::v7::to_string_view<char,_0>("cannot find {0}");
  format_str.data_ = (char *)bVar4.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_38;
  fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)bVar4.data_,format_str,args);
  UserException::UserException(this_00,&local_58);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Port> FunctionStmtBlock::get_port(const std::string &port_name) {
    if (ports_.find(port_name) == ports_.end())
        throw UserException(::format("cannot find {0}", port_name));
    return ports_.at(port_name);
}